

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void print_subscript(char *pre,int ndim,int *subscript,char *post)

{
  ulong uVar1;
  
  printf("%s [",pre);
  if (0 < ndim) {
    uVar1 = 0;
    do {
      printf("%d",(ulong)(uint)subscript[uVar1]);
      if (ndim - 1 == uVar1) {
        printf("] %s",post);
      }
      else {
        putchar(0x2c);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)ndim != uVar1);
  }
  return;
}

Assistant:

void print_subscript(char *pre,int ndim, int subscript[], char* post)
{
    int i;

    printf("%s [",pre);
    for(i=0;i<ndim;i++){
        printf("%d",subscript[i]);
        if(i==ndim-1)printf("] %s",post);
        else printf(",");
    }
}